

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createPow(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  ConstantValue<long,_(flow::LiteralType)2> *pCVar2;
  BinaryInstr<(flow::BinaryOperator)5,_(flow::LiteralType)2> *pBVar3;
  longdouble in_ST0;
  Value *local_50;
  Value *local_48;
  string local_40;
  
  local_50 = rhs;
  local_48 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x108,"Value *flow::IRBuilder::createPow(Value *, Value *, const std::string &)")
    ;
  }
  if (lhs->type_ == Number) {
    lVar1 = __dynamic_cast(lhs,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,
                           0);
    if ((lVar1 != 0) &&
       (lVar1 = __dynamic_cast(rhs,&Value::typeinfo,
                               &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0), lVar1 != 0))
    {
      powl();
      local_40._M_dataplus._M_p = (pointer)(long)ROUND(in_ST0);
      pCVar2 = IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                         (this->program_,&this->program_->numbers_,(long *)&local_40);
      return (Value *)pCVar2;
    }
    makeName(&local_40,this,name);
    pBVar3 = insert<flow::BinaryInstr<(flow::BinaryOperator)5,(flow::LiteralType)2>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                       (this,&local_48,&local_50,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return (Value *)pBVar3;
  }
  __assert_fail("lhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x109,"Value *flow::IRBuilder::createPow(Value *, Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createPow(Value* lhs, Value* rhs, const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(lhs))
    if (auto b = dynamic_cast<ConstantInt*>(rhs))
      return get(powl(a->get(), b->get()));

  return insert<IPowInstr>(lhs, rhs, makeName(name));
}